

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# w3.cpp
# Opt level: O2

int main(int argc,PCH *argv)

{
  char *__s1;
  bool bVar1;
  bool bVar2;
  int iVar3;
  long lVar4;
  ulong uVar5;
  long lVar6;
  bool bVar7;
  ulong uStack_640;
  undefined1 local_628 [24];
  pointer local_610;
  pointer pwStack_608;
  w3Module *local_600;
  w3ModuleInstance *pwStack_5f8;
  w3Frame *local_5f0;
  _Vector_base<w3StackValue,_std::allocator<w3StackValue>_> *local_5e8;
  w3Module module;
  
  w3Module::w3Module(&module);
  if (argc < 0) {
    AssertFailed("argc >= 0");
  }
  uVar5 = 1;
  bVar7 = false;
  bVar2 = false;
  bVar1 = false;
  uStack_640 = uVar5;
  do {
    if ((uint)argc <= uVar5) {
      w3Module::read_module(&module,argv[uStack_640]);
      if (bVar7) {
        lVar4 = ((long)module.exports.super__Vector_base<w3Export,_std::allocator<w3Export>_>.
                       _M_impl.super__Vector_impl_data._M_finish -
                (long)module.exports.super__Vector_base<w3Export,_std::allocator<w3Export>_>._M_impl
                      .super__Vector_impl_data._M_start) / 0x48;
        lVar6 = 0;
        while (bVar7 = lVar4 != 0, lVar4 = lVar4 + -1, bVar7) {
          if (*(int *)((long)&(module.exports.
                               super__Vector_base<w3Export,_std::allocator<w3Export>_>._M_impl.
                               super__Vector_impl_data._M_start)->tag + lVar6) == 0) {
            local_610 = (pointer)0x0;
            pwStack_608 = (pointer)0x0;
            local_628._8_8_ = (w3DecodedInstruction *)0x0;
            local_628._16_8_ = (pointer)0x0;
            local_628._0_8_ = &PTR__w3Interp_00131c50;
            local_600 = (w3Module *)0x0;
            pwStack_5f8 = (w3ModuleInstance *)0x0;
            local_5f0 = (w3Frame *)0x0;
            local_5e8 = (_Vector_base<w3StackValue,_std::allocator<w3StackValue>_> *)
                        (local_628 + 0x10);
            w3Interp::interp((w3Interp *)local_628,&module,
                             (w3Export *)
                             ((long)&((module.exports.
                                       super__Vector_base<w3Export,_std::allocator<w3Export>_>.
                                       _M_impl.super__Vector_impl_data._M_start)->name).data + lVar6
                             ));
            std::_Vector_base<w3StackValue,_std::allocator<w3StackValue>_>::~_Vector_base
                      ((_Vector_base<w3StackValue,_std::allocator<w3StackValue>_> *)
                       (local_628 + 0x10));
          }
          lVar6 = lVar6 + 0x48;
        }
      }
      if (bVar1 || bVar2) {
        WasmCGen::WasmCGen((WasmCGen *)local_628);
        WasmCGen::interp((WasmCGen *)local_628,&module,(w3Export *)0x0);
        w3SourceGen::~w3SourceGen((w3SourceGen *)local_628);
      }
      w3Module::~w3Module(&module);
      return 0;
    }
    __s1 = argv[uVar5];
    iVar3 = strcmp(__s1,"--cgen");
    if (iVar3 == 0) {
      bVar1 = true;
      if (uVar5 == 1) {
        uStack_640 = 2;
      }
      else if (uVar5 == 2) {
        uStack_640 = 1;
      }
    }
    iVar3 = strcmp(__s1,"--rust-gen");
    if (iVar3 == 0) {
      bVar2 = true;
LAB_0011db30:
      if (uVar5 == 1) {
        uStack_640 = 2;
      }
      else if (uVar5 == 2) {
        uStack_640 = 1;
      }
    }
    else {
      iVar3 = strcmp(__s1,"--run-all-exports");
      if (iVar3 == 0) {
        bVar7 = true;
        goto LAB_0011db30;
      }
    }
    uVar5 = uVar5 + 1;
  } while( true );
}

Assistant:

int
main (int argc, PCH* argv)
{
    if (IsDebuggerPresent ()) DebugBreak ();
#if 0 // test code TODO move it elsewhere? Or under a switch.
    printf ("3 %s\n", InstructionName (1));
    printf ("4 %s\n", InstructionName (0x44));
    char buf [99] = { 0 };
    uint32_t len;
#define Xd(x) printf ("%s %I64d\n", #x, x);
#define Xx(x) printf ("%s %I64x\n", #x, x);
#define Xs(x) len = x; buf [len] = 0; printf ("%s %s\n", #x, buf);
    Xd (UIntGetPrecision (0));
    Xd (UIntGetPrecision (1));
    Xd (UIntGetPrecision (0x2));
    Xd (UIntGetPrecision (0x2));
    Xd (UIntGetPrecision (0x7));
    Xd (UIntGetPrecision (0x8));
    Xd (IntGetPrecision (0));
    Xd (IntGetPrecision (1));
    Xd (IntGetPrecision (0x2));
    Xd (IntGetPrecision (0x2));
    Xd (IntGetPrecision (0x7));
    Xd (IntGetPrecision (0x8));
    Xd (IntGetPrecision (0));
    Xd (IntGetPrecision (-1));
    Xd (IntGetPrecision (-0x2));
    Xd (IntGetPrecision (-0x2));
    Xd (IntGetPrecision (-0x7));
    Xd (IntGetPrecision (-0x8));
    Xd (IntToDec_GetLength (0))
    Xd (IntToDec_GetLength (1))
    Xd (IntToDec_GetLength (2))
    Xd (IntToDec_GetLength (300))
    Xd (IntToDec_GetLength (-1))
    Xx (SignExtend (0xf, 0));
    Xx (SignExtend (0xf, 1));
    Xx (SignExtend (0xf, 2));
    Xx (SignExtend (0xf, 3));
    Xx (SignExtend (0xf, 4));
    Xx (SignExtend (0xf, 5));
    Xd (IntToHex_GetLength (0xffffffffa65304e4));
    Xd (IntToHex_GetLength (0xfffffffa65304e4));
    Xd (IntToHex_GetLength (-1));
    Xd (IntToHex_GetLength (-1ui64>>4));
    Xd (IntToHex_GetLength (0xf));
    Xd (IntToHex_GetLength (32767));
    Xd (IntToHex_GetLength (-32767));
    Xs (IntToHex (32767, buf));
    Xs (IntToHex (-32767, buf));
    Xs (IntToHex8 (0x123, buf));
    Xs (IntToHex8 (0xffffffffa65304e4, buf));
    Xs (IntToHex8 (-1, buf));
    Xs (IntToHex (0x1, buf));
    Xs (IntToHex (0x12, buf));
    Xs (IntToHex (0x123, buf));
    Xs (IntToHex (0x12345678, buf));
    Xs (IntToHex (-1, buf));
    Xd (IntToHex_GetLength (0x1));
    Xd (IntToHex_GetLength (0x12));
    Xd (IntToHex_GetLength (0x12345678));
    Xd (IntToHex_GetLength (0x01234567));
    Xd (IntToHex_GetLength (-1));
    Xd (IntToHex_GetLength (~0u >> 1));
    Xd (IntToHex_GetLength (~0u >> 2));
    Xd (IntToHex_GetLength (~0u >> 4));
    exit (0);
#endif
#if 1
    try
#endif
    {
        // FIXME command line parsing
        // FIXME verbosity
        w3Module module;

        // Support --run-all-exports for wabt test suite.

        size_t file = 1;
        size_t i = 0;
        bool run_all_exports = 0;
        bool rust_gen = 0;
        bool cgen = 0;

        Assert(argc >= 0);
        for (i = 1 ; i < (uint32_t)argc; ++i)
        {
            if (strcmp (argv [i], "--cgen") == 0)
            {
                cgen = true;
                if (i == 1)
                    file = 2;
                else if (i == 2)
                    file = 1;
            }
            if (strcmp (argv [i], "--rust-gen") == 0)
            {
                rust_gen = true;
                if (i == 1)
                    file = 2;
                else if (i == 2)
                    file = 1;
            }
            else if (strcmp (argv [i], "--run-all-exports") == 0)
            {
                run_all_exports = true;
                if (i == 1)
                    file = 2;
                else if (i == 2)
                    file = 1;
            }
        }

        module.read_module (argv [file]);

        if (run_all_exports)
        {
            const size_t j = module.exports.size ();
            for (i = 0; i < j; ++i)
            {
                w3Export* const xport = &module.exports [i];
                if (xport->tag != w3ExportTag_Function)
                    continue;
                w3Interp().interp (&module, xport);
            }
        }

        if (cgen || rust_gen)
        {
            WasmCGen().interp (&module);
        }
    }
#if 1
    catch (int er)
    {
        fprintf (stderr, "error 0x%08X\n", er);
    }
    catch (const std::string& er)
    {
        fprintf (stderr, "%s", er.c_str ());
    }
#endif
    return 0;
}